

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-subfilter.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sub_filters;
  Mat test_image_copy;
  Mat test_image;
  Mat test_image_sized;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_178;
  undefined8 local_160;
  undefined8 local_158;
  undefined4 local_150 [2];
  Mat *local_148;
  undefined8 local_140;
  Mat local_f0 [8];
  int local_e8;
  int local_e4;
  long local_e0;
  long *local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [3];
  
  cv::Mat::Mat(local_f0);
  local_158 = 0x1e000000280;
  cv::Mat::create(local_f0,&local_158,0x10);
  if (0 < local_e8) {
    lVar6 = 0;
    do {
      if (0 < local_e4) {
        lVar9 = 2;
        lVar7 = 0;
        do {
          lVar8 = *local_a8 * lVar6 + local_e0;
          iVar2 = rand();
          iVar3 = rand();
          iVar4 = rand();
          *(char *)(lVar9 + -2 + lVar8) =
               ((char)(uint)((ulong)((long)iVar2 * 0x80808081) >> 0x27) - (char)(iVar2 >> 0x1f)) +
               (char)iVar2;
          *(char *)(lVar9 + -1 + lVar8) =
               ((char)(uint)((ulong)((long)iVar3 * 0x80808081) >> 0x27) -
               (char)((long)iVar3 * 0x80808081 >> 0x3f)) + (char)iVar3;
          *(char *)(lVar9 + lVar8) =
               ((char)(uint)((ulong)((long)iVar4 * 0x80808081) >> 0x27) -
               (char)((long)iVar4 * 0x80808081 >> 0x3f)) + (char)iVar4;
          lVar7 = lVar7 + 1;
          lVar9 = lVar9 + 3;
        } while (lVar7 < local_e4);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < local_e8);
  }
  cVar1 = cv::Mat::empty();
  if (cVar1 == '\0') {
    cv::Mat::Mat((Mat *)local_90);
    local_140 = 0;
    local_150[0] = 0x1010000;
    local_178.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_178.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_178.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,0x2010000);
    local_160 = 0x1e000000280;
    local_178.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = local_90;
    local_148 = local_f0;
    cv::resize(0,0);
    ac::fill_filter_map();
    cv::Mat::clone();
    cv::Mat::operator=((Mat *)&ac::orig_frame,(Mat *)local_150);
    cv::Mat::~Mat((Mat *)local_150);
    cv::Mat::clone();
    cv::Mat::operator=((Mat *)&blend_image,(Mat *)local_150);
    cv::Mat::~Mat((Mat *)local_150);
    LOCK();
    blend_set = 1;
    UNLOCK();
    local_178.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_178.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_178.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    buildFilters(&local_178);
    if (local_178.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_178.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar10 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Testing Filter: ",0x10);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,
                            local_178.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar10]._M_dataplus._M_p,
                            local_178.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar10]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        iVar2 = 10;
        do {
          cv::Mat::clone();
          LOCK();
          ac::subfilter._0_4_ = 0;
          UNLOCK();
          ac::CallFilter((string *)
                         (local_178.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar10),(Mat *)local_150);
          cv::Mat::~Mat((Mat *)local_150);
          iVar2 = iVar2 + -1;
        } while (iVar2 != 0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Passed Test...\n",0xf);
        ac::release_all_objects();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Cleared Frames...\n",0x12);
        uVar10 = (ulong)((int)uVar10 + 1);
      } while (uVar10 < (ulong)((long)local_178.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_178.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Passed ",7);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," Image Filter Tests...\n",0x17);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_178);
    cv::Mat::~Mat((Mat *)local_90);
    cv::Mat::~Mat(local_f0);
    return 0;
  }
  std::operator<<((ostream *)&std::cerr,"Error image could not be loaded.\n");
  exit(1);
}

Assistant:

int main(int argc, char **argv) {
    cv::Mat test_image;
    test_image.create(cv::Size(640, 480), CV_8UC3);
    for(int z = 0; z < test_image.rows; ++z) {
        for(int i = 0; i < test_image.cols; ++i) {
            cv::Vec3b &pixel = test_image.at<cv::Vec3b>(z, i);
            pixel = cv::Vec3b(rand()%255, rand()%255, rand()%255);
        }
    }
    if(test_image.empty()) {
        std::cerr << "Error image could not be loaded.\n";
        exit(EXIT_FAILURE);
    }
    // setup test image
    cv::Mat test_image_sized;
    cv::resize(test_image, test_image_sized, cv::Size(640, 480));
    // initialize libacidcam
    ac::fill_filter_map();
    ac::orig_frame = test_image_sized.clone();
    blend_image = test_image_sized.clone();
    blend_set = true;
    // create vector of filters
    std::vector<std::string> sub_filters;
    // populate vector with image filters
    buildFilters(sub_filters);
    for(unsigned int i = 0; i < sub_filters.size(); ++i) {
        std::cout << "Testing Filter: " << sub_filters[i] << "\n";
        for(int j = 0; j < 10; ++j) {
            cv::Mat test_image_copy = test_image_sized.clone();
            ac::subfilter = 0;
            ac::CallFilter(sub_filters[i], test_image_copy);
        }
        std::cout << "Passed Test...\n";
        ac::release_all_objects();
        std::cout << "Cleared Frames...\n";
    }
    std::cout << "Passed " << sub_filters.size() << " Image Filter Tests...\n";
    return 0;
}